

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain_struct
          (CompilerHLSL *this,string *lhs,SPIRAccessChain *chain)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRType *type;
  ulong uVar5;
  SPIRType *pSVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint32_t index;
  ulong uVar7;
  string local_118;
  string local_f8;
  undefined1 local_d8 [24];
  _Alloc_hider local_c0;
  char local_b0 [16];
  _Alloc_hider local_a0;
  char local_90 [16];
  int local_80;
  VariableID VStack_7c;
  undefined8 uStack_78;
  ushort local_70;
  undefined1 local_68 [56];
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(chain->super_IVariant).field_0xc);
  local_d8._8_4_ = (chain->super_IVariant).self.id;
  local_d8._0_8_ = &PTR__SPIRAccessChain_003a8fd0;
  local_d8._12_8_ = *(undefined8 *)&(chain->super_IVariant).field_0xc;
  local_c0._M_p = local_b0;
  pcVar2 = (chain->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + (chain->base)._M_string_length);
  local_a0._M_p = local_90;
  pcVar2 = (chain->dynamic_index)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (chain->dynamic_index)._M_string_length);
  local_70._0_1_ = chain->row_major_matrix;
  local_70._1_1_ = chain->immutable;
  local_80 = chain->static_index;
  VStack_7c.id = (chain->loaded_from).id;
  uStack_78._0_4_ = chain->matrix_stride;
  uStack_78._4_4_ = chain->array_stride;
  local_68._0_8_ = local_68 + 0x18;
  local_68._8_8_ = 0;
  local_68._16_8_ = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)local_68,
             &chain->implied_read_expressions);
  uVar5 = (ulong)(uint)(type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  if (uVar5 != 0) {
    uVar7 = 0;
    do {
      index = (uint32_t)uVar7;
      uVar4 = Compiler::type_struct_member_offset((Compiler *)this,type,index);
      local_80 = uVar4 + chain->static_index;
      uVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              ptr[uVar7].id;
      local_d8._12_4_ = uVar1;
      local_70 = local_70 & 0xff00;
      uStack_78._0_4_ = 0;
      uStack_78._4_4_ = 0;
      pSVar6 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + uVar1);
      if (1 < pSVar6->columns) {
        uVar4 = Compiler::type_struct_member_matrix_stride((Compiler *)this,type,index);
        uStack_78._0_4_ = uVar4;
        bVar3 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationRowMajor);
        local_70 = CONCAT11(local_70._1_1_,bVar3);
      }
      if ((pSVar6->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        uVar4 = Compiler::type_struct_member_array_stride((Compiler *)this,type,index);
        uStack_78._4_4_ = uVar4;
      }
      CompilerGLSL::to_member_name_abi_cxx11_(&local_118,&this->super_CompilerGLSL,type,index);
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                (&local_f8,(spirv_cross *)lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x314813,
                 (char (*) [2])&local_118,in_R8);
      read_access_chain(this,(string *)0x0,&local_f8,(SPIRAccessChain *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  local_d8._0_8_ = &PTR__SPIRAccessChain_003a8fd0;
  local_68._8_8_ = 0;
  if ((TypedID<(spirv_cross::Types)0> *)local_68._0_8_ !=
      (TypedID<(spirv_cross::Types)0> *)(local_68 + 0x18)) {
    free((void *)local_68._0_8_);
  }
  if (local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p);
  }
  if (local_c0._M_p != local_b0) {
    operator_delete(local_c0._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::read_access_chain_struct(const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);
	auto subchain = chain;
	uint32_t member_count = uint32_t(type.member_types.size());

	for (uint32_t i = 0; i < member_count; i++)
	{
		uint32_t offset = type_struct_member_offset(type, i);
		subchain.static_index = chain.static_index + offset;
		subchain.basetype = type.member_types[i];

		subchain.matrix_stride = 0;
		subchain.array_stride = 0;
		subchain.row_major_matrix = false;

		auto &member_type = get<SPIRType>(subchain.basetype);
		if (member_type.columns > 1)
		{
			subchain.matrix_stride = type_struct_member_matrix_stride(type, i);
			subchain.row_major_matrix = has_member_decoration(type.self, i, DecorationRowMajor);
		}

		if (!member_type.array.empty())
			subchain.array_stride = type_struct_member_array_stride(type, i);

		read_access_chain(nullptr, join(lhs, ".", to_member_name(type, i)), subchain);
	}
}